

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O3

int vm_get_game_type_for_file(char *filename)

{
  FILE *__stream;
  size_t sVar1;
  int iVar2;
  char buf [16];
  undefined3 local_28;
  undefined5 uStack_25;
  int local_20;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    iVar2 = -1;
  }
  else {
    sVar1 = fread(&local_28,0x10,1,__stream);
    iVar2 = -2;
    if (sVar1 == 1) {
      if (local_20 == 0x1a0d0a6e && CONCAT53(uStack_25,local_28) == 0x6962203253444154) {
        iVar2 = 2;
      }
      else {
        iVar2 = (uint)(CONCAT35((undefined3)local_20,uStack_25) == 0x1a0a0d6567616d69 &&
                      CONCAT53(uStack_25,local_28) == 0x6567616d692d3354) * 5 + -2;
      }
    }
    fclose(__stream);
  }
  return iVar2;
}

Assistant:

static int vm_get_game_type_for_file(const char *filename)
{
    osfildef *fp;
    char buf[16];
    int ret;
    
    /* try opening the filename exactly as given */
    fp = osfoprb(filename, OSFTBIN);

    /* if the file doesn't exist, tell the caller */
    if (fp == 0)
        return VM_GGT_NOT_FOUND;

    /* read the first few bytes of the file, where the signature resides */
    if (osfrb(fp, buf, 16))
    {
        /* 
         *   error reading the file - any valid game file is going to be at
         *   least long enough to hold the number of bytes we asked for, so
         *   it must not be a valid file 
         */
        ret = VM_GGT_INVALID;
    }
    else
    {
        /* check the signature we read against the known signatures */
        if (memcmp(buf, "TADS2 bin\012\015\032", 12) == 0)
            ret = VM_GGT_TADS2;
        else if (memcmp(buf, "T3-image\015\012\032", 11) == 0)
            ret = VM_GGT_TADS3;
        else
            ret = VM_GGT_INVALID;
    }

    /* close the file */
    osfcls(fp);

    /* return the version identifier */
    return ret;
}